

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool ON_SubDEdgeChain::IsClosed(size_t edge_count,ON_SubDEdgePtr *edges)

{
  ON_SubDVertex *pOVar1;
  ON_SubDVertex *pOVar2;
  ulong local_30;
  size_t i;
  ON_SubDVertex *v;
  ON_SubDEdgePtr *edges_local;
  size_t edge_count_local;
  
  if ((edge_count < 3) || (edges == (ON_SubDEdgePtr *)0x0)) {
    edge_count_local._7_1_ = false;
  }
  else {
    pOVar1 = ON_SubDEdgePtr::RelativeVertex(edges,0);
    if (pOVar1 == (ON_SubDVertex *)0x0) {
      edge_count_local._7_1_ = false;
    }
    else {
      pOVar2 = ON_SubDEdgePtr::RelativeVertex(edges + (edge_count - 1),1);
      if (pOVar1 == pOVar2) {
        i = (size_t)ON_SubDEdgePtr::RelativeVertex(edges,1);
        for (local_30 = 1; local_30 < edge_count; local_30 = local_30 + 1) {
          if (i == 0) {
            return false;
          }
          pOVar1 = ON_SubDEdgePtr::RelativeVertex(edges + local_30,0);
          if ((ON_SubDVertex *)i != pOVar1) {
            return false;
          }
          i = (size_t)ON_SubDEdgePtr::RelativeVertex(edges + local_30,1);
        }
        edge_count_local._7_1_ = true;
      }
      else {
        edge_count_local._7_1_ = false;
      }
    }
  }
  return edge_count_local._7_1_;
}

Assistant:

bool ON_SubDEdgeChain::IsClosed(
  size_t edge_count,
  const ON_SubDEdgePtr* edges
)
{
  if (edge_count < 3 || nullptr == edges)
    return false;
  const ON_SubDVertex* v = edges[0].RelativeVertex(0);
  if (nullptr == v)
    return false;
  if (v != edges[edge_count - 1].RelativeVertex(1))
    return false;

  v = edges[0].RelativeVertex(1);
  for (size_t i = 1; i < edge_count; ++i)
  {
    if (nullptr == v)
      return false;
    if (v != edges[i].RelativeVertex(0))
      return false;
    v = edges[i].RelativeVertex(1);
  }

  return true;

}